

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Option<unsigned_long> * Catch::list(Option<unsigned_long> *__return_storage_ptr__,Config *config)

{
  bool bVar1;
  unsigned_long uVar2;
  size_t sVar3;
  unsigned_long local_70;
  unsigned_long local_68 [3];
  unsigned_long local_50;
  unsigned_long local_48 [5];
  undefined1 local_19;
  Config *local_18;
  Config *config_local;
  Option<unsigned_long> *listedCount;
  
  local_19 = 0;
  local_18 = config;
  config_local = (Config *)__return_storage_ptr__;
  Option<unsigned_long>::Option(__return_storage_ptr__);
  bVar1 = Config::listTests(local_18);
  if (bVar1) {
    local_48[1] = 0;
    uVar2 = Option<unsigned_long>::valueOr(__return_storage_ptr__,local_48 + 1);
    sVar3 = listTests(local_18);
    local_48[2] = uVar2 + sVar3;
    Option<unsigned_long>::operator=(__return_storage_ptr__,local_48 + 2);
  }
  bVar1 = Config::listTestNamesOnly(local_18);
  if (bVar1) {
    local_50 = 0;
    uVar2 = Option<unsigned_long>::valueOr(__return_storage_ptr__,&local_50);
    sVar3 = listTestsNamesOnly(local_18);
    local_48[0] = uVar2 + sVar3;
    Option<unsigned_long>::operator=(__return_storage_ptr__,local_48);
  }
  bVar1 = Config::listTags(local_18);
  if (bVar1) {
    local_68[1] = 0;
    uVar2 = Option<unsigned_long>::valueOr(__return_storage_ptr__,local_68 + 1);
    sVar3 = listTags(local_18);
    local_68[2] = uVar2 + sVar3;
    Option<unsigned_long>::operator=(__return_storage_ptr__,local_68 + 2);
  }
  bVar1 = Config::listReporters(local_18);
  if (bVar1) {
    local_70 = 0;
    uVar2 = Option<unsigned_long>::valueOr(__return_storage_ptr__,&local_70);
    sVar3 = listReporters(local_18);
    local_68[0] = uVar2 + sVar3;
    Option<unsigned_long>::operator=(__return_storage_ptr__,local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Option<std::size_t> list( Config const& config ) {
        Option<std::size_t> listedCount;
        if( config.listTests() )
            listedCount = listedCount.valueOr(0) + listTests( config );
        if( config.listTestNamesOnly() )
            listedCount = listedCount.valueOr(0) + listTestsNamesOnly( config );
        if( config.listTags() )
            listedCount = listedCount.valueOr(0) + listTags( config );
        if( config.listReporters() )
            listedCount = listedCount.valueOr(0) + listReporters( config );
        return listedCount;
    }